

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::SourceCodeInfo_Location::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
    uVar1 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 6));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[6]._internal_metadata_);
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&self[4]._internal_metadata_);
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 3));
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)&self[1]._internal_metadata_);
    return;
  }
  SharedDtor((SourceCodeInfo_Location *)&stack0xffffffffffffffe0);
}

Assistant:

inline void SourceCodeInfo_Location::SharedDtor(MessageLite& self) {
  SourceCodeInfo_Location& this_ = static_cast<SourceCodeInfo_Location&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.leading_comments_.Destroy();
  this_._impl_.trailing_comments_.Destroy();
  this_._impl_.~Impl_();
}